

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void check_output(void *input_buffer,void *output_buffer,long frame_count)

{
  bool bVar1;
  long in_RSI;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  bool *in_stack_ffffffffffffff48;
  AssertionResult *in_stack_ffffffffffffff50;
  void **in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  Type in_stack_ffffffffffffff7c;
  Type type;
  AssertHelper *in_stack_ffffffffffffff80;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar2;
  char *in_stack_ffffffffffffffc0;
  AssertionResult *in_stack_ffffffffffffffc8;
  AssertHelper *this;
  AssertionResult local_28;
  long local_10;
  
  this = (AssertHelper *)0x0;
  local_10 = in_RSI;
  testing::internal::EqHelper::Compare<const_void_*,_std::nullptr_t,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(void **)in_stack_ffffffffffffff50)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80);
    testing::AssertionResult::failure_message((AssertionResult *)0x10f965);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
    testing::internal::AssertHelper::operator=(this,(Message *)in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
    testing::Message::~Message((Message *)0x10f9ac);
  }
  uVar2 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f9cb);
  if (uVar2 == 0) {
    testing::internal::EqHelper::Compare<long,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,(long *)in_stack_ffffffffffffff58,
               (int *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffffa8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80);
      testing::AssertionResult::failure_message((AssertionResult *)0x10fa2d);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=(this,(Message *)in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0x10fa6e);
    }
    uVar2 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fa8a);
    if (uVar2 == 0) {
      type = CONCAT13(local_10 != 0,(int3)in_stack_ffffffffffffff7c);
      testing::AssertionResult::AssertionResult<bool>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(type *)0x10fac2);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff80);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   (char *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),
                   (char *)in_stack_ffffffffffffffb0._M_head_impl);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff80,type,in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
        testing::internal::AssertHelper::operator=(this,(Message *)in_stack_ffffffffffffffc8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
        testing::Message::~Message((Message *)0x10fb54);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10fb70);
    }
  }
  return;
}

Assistant:

void
check_output(const void * input_buffer, void * output_buffer, long frame_count)
{
  ASSERT_EQ(input_buffer, nullptr);
  ASSERT_EQ(frame_count, 256);
  ASSERT_TRUE(!!output_buffer);
}